

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall
QSplitterPrivate::doMove
          (QSplitterPrivate *this,bool backwards,int hPos,int index,int delta,bool mayCollapse,
          int *positions,int *widths)

{
  Orientation OVar1;
  QWidget *w;
  Representation RVar2;
  byte bVar3;
  ulong uVar4;
  QSplitterLayoutStruct *pQVar5;
  undefined8 uVar6;
  QSplitterLayoutStruct *pQVar7;
  QSize QVar8;
  Representation RVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
LAB_0048c406:
  do {
    uVar4 = (ulong)(uint)index;
    do {
      do {
        if (((int)uVar4 < 0) || ((ulong)(this->list).d.size <= uVar4)) {
          return;
        }
        pQVar5 = (this->list).d.ptr[uVar4];
        w = pQVar5->widget;
        iVar12 = delta;
        if (backwards) {
          iVar12 = -delta;
        }
        index = iVar12 + (int)uVar4;
        if ((w->data->widget_attributes & 0x10000) == 0) {
          iVar12 = 0;
          if ((((pQVar5->handle->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
            OVar1 = this->orient;
            uVar6 = (**(code **)(*(long *)&pQVar5->handle->super_QWidget + 0x70))();
            iVar12 = (int)((ulong)uVar6 >> 0x20);
            if (OVar1 == Horizontal) {
              iVar12 = (int)uVar6;
            }
          }
          if (backwards) {
            pQVar7 = (QSplitterLayoutStruct *)&(pQVar5->rect).y1;
            if (this->orient == Horizontal) {
              pQVar7 = pQVar5;
            }
            iVar11 = hPos - (pQVar7->rect).x1.m_i;
          }
          else {
            iVar11 = ((&(pQVar5->rect).x2)[this->orient != Horizontal].m_i - (hPos + iVar12)) + 1;
          }
          if ((0 < iVar11) || (RVar9.m_i = 0, ((mayCollapse | pQVar5->field_0x14) & 1U) == 0)) {
            QVar8 = qSmartMaxSize(w,(Alignment)0x0);
            RVar2 = QVar8.ht.m_i;
            if (this->orient == Horizontal) {
              RVar2 = QVar8.wd.m_i;
            }
            if (iVar11 < RVar2.m_i) {
              RVar2.m_i = iVar11;
            }
            QVar8 = qSmartMinSize(w);
            RVar9 = QVar8.ht.m_i;
            if (this->orient == Horizontal) {
              RVar9 = QVar8.wd.m_i;
            }
            if (RVar9.m_i < RVar2.m_i) {
              RVar9.m_i = RVar2.m_i;
            }
          }
          iVar10 = hPos - (iVar12 + RVar9.m_i);
          iVar11 = hPos - RVar9.m_i;
          if (!backwards) {
            iVar11 = iVar12 + hPos;
          }
          positions[uVar4] = iVar11;
          widths[uVar4] = RVar9.m_i;
          hPos = RVar9.m_i + iVar12 + hPos;
          if (backwards) {
            hPos = iVar10;
          }
          mayCollapse = (bool)1;
          if ((index < 0) || ((ulong)(this->list).d.size <= (ulong)(uint)index)) goto LAB_0048c406;
          pQVar5 = (this->list).d.ptr[(uint)index];
          goto LAB_0048c46b;
        }
        mayCollapse = true;
        uVar4 = (ulong)(uint)index;
      } while (index < 0);
      uVar4 = (ulong)(uint)index;
    } while ((ulong)(this->list).d.size <= (ulong)(uint)index);
    pQVar5 = (this->list).d.ptr[(uint)index];
LAB_0048c46b:
    bVar3 = (byte)pQVar5->field_0x14 >> 1 & 3;
    mayCollapse = (bool)this->field_0x2a6;
    if (bVar3 != 2) {
      mayCollapse = bVar3 != 0;
    }
  } while( true );
}

Assistant:

void QSplitterPrivate::doMove(bool backwards, int hPos, int index, int delta, bool mayCollapse,
                              int *positions, int *widths)
{
    if (index < 0 || index >= list.size())
        return;

#ifdef QSPLITTER_DEBUG
    qDebug() << "QSplitterPrivate::doMove" << backwards << hPos << index << delta << mayCollapse;
#endif

    QSplitterLayoutStruct *s = list.at(index);
    QWidget *w = s->widget;

    int nextId = backwards ? index - delta : index + delta;

    if (w->isHidden()) {
        doMove(backwards, hPos, nextId, delta, collapsible(nextId), positions, widths);
    } else {
        int hs =s->handle->isHidden() ? 0 : s->getHandleSize(orient);

        int  ws = backwards ? hPos - pick(s->rect.topLeft())
                 : pick(s->rect.bottomRight()) - hPos -hs + 1;
        if (ws > 0 || (!s->collapsed && !mayCollapse)) {
            ws = qMin(ws, pick(qSmartMaxSize(w)));
            ws = qMax(ws, pick(qSmartMinSize(w)));
        } else {
            ws = 0;
        }
        positions[index] = backwards ? hPos - ws : hPos + hs;
        widths[index] = ws;
        doMove(backwards, backwards ? hPos - ws - hs : hPos + hs + ws, nextId, delta,
               collapsible(nextId), positions, widths);
    }

}